

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O2

uint8_t * __thiscall
edition_unittest::TestExtensionRangeSerialize::_InternalSerialize
          (TestExtensionRangeSerialize *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  anon_union_48_1_493b367e_for_TestExtensionRangeSerialize_13 *this_00;
  uint uVar1;
  ulong uVar2;
  uint8_t *puVar3;
  
  this_00 = &this->field_0;
  uVar1 = *(uint *)((long)&this->field_0 + 0x18);
  if ((uVar1 & 1) != 0) {
    target = google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>
                       (stream,(this->field_0)._impl_.foo_one_,target);
  }
  puVar3 = google::protobuf::internal::ExtensionSet::_InternalSerialize
                     (&(this_00->_impl_)._extensions_,
                      (MessageLite *)_TestExtensionRangeSerialize_default_instance_,2,5,target,
                      stream);
  if ((uVar1 & 2) != 0) {
    puVar3 = google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<6>
                       (stream,(this->field_0)._impl_.foo_two_,puVar3);
  }
  if ((uVar1 & 4) != 0) {
    puVar3 = google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<7>
                       (stream,(this->field_0)._impl_.foo_three_,puVar3);
  }
  puVar3 = google::protobuf::internal::ExtensionSet::_InternalSerialize
                     (&(this_00->_impl_)._extensions_,
                      (MessageLite *)_TestExtensionRangeSerialize_default_instance_,9,0xb,puVar3,
                      stream);
  if ((uVar1 & 8) != 0) {
    puVar3 = google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<13>
                       (stream,(this->field_0)._impl_.foo_four_,puVar3);
  }
  puVar3 = google::protobuf::internal::ExtensionSet::_InternalSerialize
                     (&(this_00->_impl_)._extensions_,
                      (MessageLite *)_TestExtensionRangeSerialize_default_instance_,0xf,0x14,puVar3,
                      stream);
  uVar2 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar2 & 1) == 0) {
    return puVar3;
  }
  puVar3 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                     ((UnknownFieldSet *)((uVar2 & 0xfffffffffffffffe) + 8),puVar3,stream);
  return puVar3;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestExtensionRangeSerialize::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestExtensionRangeSerialize& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:edition_unittest.TestExtensionRangeSerialize)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // int32 foo_one = 1;
  if ((cached_has_bits & 0x00000001u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>(
            stream, this_._internal_foo_one(), target);
  }

  // Extension range [2, 5)
  target = this_._impl_._extensions_._InternalSerialize(
      &default_instance(), 2, 5, target, stream);
  // int32 foo_two = 6;
  if ((cached_has_bits & 0x00000002u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<6>(
            stream, this_._internal_foo_two(), target);
  }

  // int32 foo_three = 7;
  if ((cached_has_bits & 0x00000004u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<7>(
            stream, this_._internal_foo_three(), target);
  }

  // Extension range [9, 11)
  target = this_._impl_._extensions_._InternalSerialize(
      &default_instance(), 9, 11, target, stream);
  // int32 foo_four = 13;
  if ((cached_has_bits & 0x00000008u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<13>(
            stream, this_._internal_foo_four(), target);
  }

  // Extension range [15, 20)
  target = this_._impl_._extensions_._InternalSerialize(
      &default_instance(), 15, 20, target, stream);
  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:edition_unittest.TestExtensionRangeSerialize)
  return target;
}